

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O3

bool __thiscall QSqlQuery::prepare(QSqlQuery *this,QString *query)

{
  Data *pDVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  NumericalPrecisionPolicy NVar5;
  int iVar6;
  QSqlResult *pQVar7;
  QSqlDriver *pQVar8;
  long in_FS_OFFSET;
  QString local_98;
  QString local_78;
  QString local_58;
  QSqlError local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = this->d->sqlResult;
  if ((this->d->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 1) {
    (*pQVar7->_vptr_QSqlResult[4])(pQVar7,0);
    pQVar7 = this->d->sqlResult;
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_78.d.size = 0;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char16_t *)0x0;
    local_98.d.size = 0;
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (char16_t *)0x0;
    QSqlError::QSqlError(&local_40,&local_58,&local_78,NoError,&local_98);
    (*pQVar7->_vptr_QSqlResult[5])(pQVar7,&local_40);
    QSqlError::~QSqlError(&local_40);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar7 = this->d->sqlResult;
    (*pQVar7->_vptr_QSqlResult[3])(pQVar7,0xffffffff);
  }
  else {
    bVar3 = QSqlResult::isForwardOnly(pQVar7);
    pQVar8 = QSqlResult::driver(this->d->sqlResult);
    pQVar7 = (QSqlResult *)(**(code **)(*(long *)pQVar8 + 200))(pQVar8);
    QSqlQuery((QSqlQuery *)&local_78,pQVar7);
    pDVar1 = local_78.d.d;
    local_78.d.d = (Data *)0x0;
    local_58.d.d = (Data *)this->d;
    this->d = (QSqlQueryPrivate *)pDVar1;
    ~QSqlQuery((QSqlQuery *)&local_58);
    ~QSqlQuery((QSqlQuery *)&local_78);
    pQVar7 = this->d->sqlResult;
    (*pQVar7->_vptr_QSqlResult[8])(pQVar7,(ulong)bVar3);
  }
  pQVar7 = this->d->sqlResult;
  NVar5 = QSqlResult::numericalPrecisionPolicy(pQVar7);
  (*pQVar7->_vptr_QSqlResult[0x1d])(pQVar7,(ulong)NVar5);
  pQVar8 = QSqlResult::driver(this->d->sqlResult);
  if (pQVar8 == (QSqlDriver *)0x0) {
    lcSqlQuery();
    if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      prepare();
    }
  }
  else {
    pQVar8 = QSqlResult::driver(this->d->sqlResult);
    cVar2 = (**(code **)(*(long *)pQVar8 + 0x60))(pQVar8);
    if (cVar2 != '\0') {
      pQVar8 = QSqlResult::driver(this->d->sqlResult);
      bVar3 = QSqlDriver::isOpenError(pQVar8);
      if (!bVar3) {
        if ((query->d).size != 0) {
          pQVar7 = this->d->sqlResult;
          iVar6 = (*pQVar7->_vptr_QSqlResult[0xb])(pQVar7,query);
          uVar4 = (undefined1)iVar6;
          goto LAB_00124088;
        }
        lcSqlQuery();
        if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
           ) {
          prepare();
        }
        goto LAB_00124086;
      }
    }
    lcSqlQuery();
    if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      prepare();
    }
  }
LAB_00124086:
  uVar4 = 0;
LAB_00124088:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQuery::prepare(const QString& query)
{
    if (d->ref.loadRelaxed() != 1) {
        bool fo = isForwardOnly();
        *this = QSqlQuery(driver()->createResult());
        setForwardOnly(fo);
        d->sqlResult->setNumericalPrecisionPolicy(d->sqlResult->numericalPrecisionPolicy());
    } else {
        d->sqlResult->setActive(false);
        d->sqlResult->setLastError(QSqlError());
        d->sqlResult->setAt(QSql::BeforeFirstRow);
        d->sqlResult->setNumericalPrecisionPolicy(d->sqlResult->numericalPrecisionPolicy());
    }
    if (!driver()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: no driver");
        return false;
    }
    if (!driver()->isOpen() || driver()->isOpenError()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: database not open");
        return false;
    }
    if (query.isEmpty()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: empty query");
        return false;
    }
#ifdef QT_DEBUG_SQL
    qCDebug(lcSqlQuery, "\n QSqlQuery::prepare: %ls", qUtf16Printable(query));
#endif
    return d->sqlResult->savePrepare(query);
}